

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O2

shared_ptr<mocker::nasm::Addr> __thiscall
mocker::anon_unknown_0::FuncSelectionContext::getIrAddr
          (FuncSelectionContext *this,shared_ptr<mocker::ir::Addr> *addr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::nasm::Addr> sVar3;
  shared_ptr<mocker::ir::Reg> reg;
  __buckets_ptr local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  pointer local_28;
  
  std::dynamic_pointer_cast<mocker::ir::IntLiteral,mocker::ir::Addr>
            ((shared_ptr<mocker::ir::Addr> *)&reg);
  if (reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::dynamic_pointer_cast<mocker::ir::Reg,mocker::ir::Addr>
              ((shared_ptr<mocker::ir::Addr> *)&reg);
    bVar2 = std::operator==(&(reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->identifier,".phi_nan");
    if (!bVar2) {
      if (reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __assert_fail("reg",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                      ,0x45,
                      "std::shared_ptr<nasm::Addr> mocker::(anonymous namespace)::FuncSelectionContext::getIrAddr(const std::shared_ptr<ir::Addr> &) const"
                     );
      }
      __r = &std::__detail::
             _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)addr,&reg)->
             super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::nasm::Register,void>
                ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)this,__r);
      goto LAB_001160e1;
    }
    local_28 = (pointer)((ulong)local_28 & 0xffffffff00000000);
    std::make_shared<mocker::nasm::NumericConstant,int>((int *)&local_38);
  }
  else {
    local_28 = ((reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               identifier)._M_dataplus._M_p;
    std::make_shared<mocker::nasm::NumericConstant,long>((long *)&local_38);
  }
  _Var1._M_pi = _Stack_30._M_pi;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->irRegAddr).mp._M_h._M_buckets = local_38;
  (this->irRegAddr).mp._M_h._M_bucket_count = (size_type)_Var1._M_pi;
  local_38 = (__buckets_ptr)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
LAB_001160e1:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar3.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Addr>)
         sVar3.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<nasm::Addr>
  getIrAddr(const std::shared_ptr<ir::Addr> &addr) const {
    if (auto p = ir::dyc<ir::IntLiteral>(addr)) {
      return std::make_shared<nasm::NumericConstant>(p->getVal());
    }
    auto reg = ir::dyc<ir::Reg>(addr);
    if (reg->getIdentifier() == ".phi_nan")
      return std::make_shared<nasm::NumericConstant>(0);
    assert(reg);
    return irRegAddr.getVReg(reg);
  }